

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printRegisterList(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  uint uVar4;
  uint uVar5;
  MCOperand *pMVar6;
  char *s;
  int iVar7;
  
  SStream_concat0(O,"{");
  uVar4 = MCInst_getNumOperands(MI);
  if (uVar4 != OpNum) {
    iVar7 = 0;
    do {
      if (iVar7 != 0) {
        SStream_concat0(O,", ");
      }
      pcVar2 = MI->csh;
      pMVar6 = MCInst_getOperand(MI,OpNum + iVar7);
      uVar5 = MCOperand_getReg(pMVar6);
      s = (*pcVar2->get_regname)(uVar5);
      SStream_concat0(O,s);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar3 = MI->flat_insn->detail;
        puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pMVar6 = MCInst_getOperand(MI,OpNum + iVar7);
        uVar5 = MCOperand_getReg(pMVar6);
        pcVar3 = MI->flat_insn->detail;
        *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
        puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
      iVar7 = iVar7 + 1;
    } while (uVar4 - OpNum != iVar7);
  }
  SStream_concat0(O,"}");
  return;
}

Assistant:

static void printRegisterList(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned i, e;
	SStream_concat0(O, "{");
	for (i = OpNum, e = MCInst_getNumOperands(MI); i != e; ++i) {
		if (i != OpNum) SStream_concat0(O, ", ");
		printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, i)));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, i));
			MI->flat_insn->detail->arm.op_count++;
		}
	}
	SStream_concat0(O, "}");
}